

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::btToLevel(SAT *this,int level)

{
  uint nelems;
  vec<Lit> *pvVar1;
  ulong uVar2;
  long lVar3;
  uint n;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (this->trail).sz;
  uVar5 = (ulong)uVar4;
  if (level < (int)(uVar4 - 1)) {
    nelems = level + 1;
    if ((int)nelems < (int)uVar4) {
      do {
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
        pvVar1 = (this->trail).data;
        lVar3 = (long)(int)pvVar1[uVar5].sz;
        pvVar1 = pvVar1 + uVar5;
        if (0 < lVar3) {
          lVar3 = lVar3 + 1;
          do {
            n = pvVar1->data[lVar3 + -2].x >> 1;
            (this->assigns).data[n] = ::l_Undef.value;
            if ((((int)(this->order_heap).indices.sz <= (int)n) ||
                ((this->order_heap).indices.data[n] < 0)) &&
               (((uint)(this->flags).data[n] & 1) != 0)) {
              Heap<SAT::VarOrderLt>::insert(&this->order_heap,n);
            }
            lVar3 = lVar3 + -1;
          } while (1 < lVar3);
        }
        pvVar1->sz = 0;
        for (uVar2 = (ulong)(this->rtrail).data[uVar5].sz; uVar2 != 0; uVar2 = uVar2 - 1) {
          free((this->rtrail).data[uVar5].data[uVar2 - 1]);
        }
      } while ((int)nelems < (int)uVar4);
    }
    vec<vec<Lit>_>::resize(&this->trail,nelems);
    (this->qhead).sz = nelems;
    vec<vec<Clause_*>_>::resize(&this->rtrail,nelems);
    Engine::btToLevel(&engine,level);
    if (so.mip != false) {
      MIP::btToLevel(mip,level);
      return;
    }
  }
  return;
}

Assistant:

void SAT::btToLevel(int level) {
#if DEBUG_VERBOSE
	std::cerr << "SAT::btToLevel( " << level << ")\n";
#endif
	if (decisionLevel() <= level) {
		return;
	}

	for (int l = trail.size(); l-- > level + 1;) {
		untrailToPos(trail[l], 0);
		for (int i = rtrail[l].size(); (i--) != 0;) {
			free(rtrail[l][i]);
		}
	}
	trail.resize(level + 1);
	qhead.resize(level + 1);
	rtrail.resize(level + 1);

	engine.btToLevel(level);
	if (so.mip) {
		mip->btToLevel(level);
	}
}